

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_visuals.cxx
# Opt level: O0

void __thiscall xray_re::xr_visual_object::save_v12(xr_visual_object *this,xr_ini_writer *w)

{
  xr_ini_writer *this_00;
  size_t __n;
  string local_38 [32];
  xr_ini_writer *local_18;
  xr_ini_writer *w_local;
  xr_visual_object *this_local;
  
  local_18 = w;
  w_local = (xr_ini_writer *)this;
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  this_00 = local_18;
  std::__cxx11::string::string(local_38,(string *)&this->m_reference);
  __n = 0;
  xr_ini_writer::write(this_00,0x2e3d4e,local_38,0);
  std::__cxx11::string::~string(local_38);
  xr_ini_writer::write(local_18,0x2e4e39,(void *)0x12,__n);
  return;
}

Assistant:

void xr_visual_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	w->write("reference_name", m_reference, false);
	w->write("version", SCENEOBJ_VERSION_18);
}